

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSendSession.cpp
# Opt level: O0

void __thiscall
FileSendSession::create_session_factory(boost::filesystem::path_const&)::$_0::__0
          (__0 *this,anon_class_32_1_89901123 *param_1)

{
  anon_class_32_1_89901123 *param_1_local;
  anon_class_32_1_89901123 *this_local;
  
  boost::filesystem::path::path((path *)this,&param_1->path);
  return;
}

Assistant:

TCPServer::SessionFactory FileSendSession::create_session_factory(const fs::path &path) {
  return [=](Poll &p, TCPServer &server, sockaddr_in client) -> std::shared_ptr<Subscriber> {
    p.unsubscribe(server);
    auto s = std::make_shared<FileSendSession>(path);
    s->when_success([](auto a) { std::cout << "Sent file " << a << std::endl; });
    s->when_error([](auto a) { std::cout << "Could not send file " << a << std::endl; });
    return s;
  };
}